

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O3

tuple<int,_int>
findMaxValue_in_map(map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                    *mp)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  long in_RSI;
  _Base_ptr local_30;
  undefined8 local_28;
  
  p_Var1 = *(_Rb_tree_node_base **)(in_RSI + 0x18);
  if (p_Var1 == (_Rb_tree_node_base *)(in_RSI + 8)) {
    local_28 = 0;
  }
  else {
    local_28 = 0;
    local_30 = (_Base_ptr)0x0;
    do {
      if ((double)local_30 < (double)p_Var1[1]._M_parent) {
        local_28 = CONCAT44((int)*(undefined8 *)(p_Var1 + 1),
                            (int)((ulong)*(undefined8 *)(p_Var1 + 1) >> 0x20));
        local_30 = p_Var1[1]._M_parent;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(in_RSI + 8));
  }
  *(undefined8 *)&(mp->_M_t)._M_impl = local_28;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)mp;
}

Assistant:

std::tuple<int,int> findMaxValue_in_map(std::map<std::pair<int,int>,double> &mp){
    double current_max = 0;
    std::tuple<int,int> argMax = std::make_tuple(0,0);
    for(auto it = mp.begin(); it!=mp.end(); it++){
        if(it->second > current_max){
            argMax = std::make_tuple(it->first.first,it->first.second);
            current_max = it->second;

        }
    }
    return argMax;
}